

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O0

int cuddZddSiftingBackward(DdManager *table,Move *moves,int size)

{
  int iVar1;
  Move *pMStack_38;
  int res;
  Move *move;
  int local_28;
  int i_best;
  int i;
  int size_local;
  Move *moves_local;
  DdManager *table_local;
  
  move._4_4_ = -1;
  local_28 = 0;
  i_best = size;
  for (pMStack_38 = moves; pMStack_38 != (Move *)0x0; pMStack_38 = pMStack_38->next) {
    if (pMStack_38->size < i_best) {
      move._4_4_ = local_28;
      i_best = pMStack_38->size;
    }
    local_28 = local_28 + 1;
  }
  local_28 = 0;
  pMStack_38 = moves;
  while( true ) {
    if ((pMStack_38 == (Move *)0x0) || (local_28 == move._4_4_)) {
      return 1;
    }
    iVar1 = cuddZddSwapInPlace(table,pMStack_38->x,pMStack_38->y);
    if (iVar1 == 0) {
      return 0;
    }
    if ((move._4_4_ == -1) && (iVar1 == i_best)) break;
    pMStack_38 = pMStack_38->next;
    local_28 = local_28 + 1;
  }
  return 1;
}

Assistant:

static int
cuddZddSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size)
{
    int         i;
    int         i_best;
    Move        *move;
    int         res;

    /* Find the minimum size among moves. */
    i_best = -1;
    for (move = moves, i = 0; move != NULL; move = move->next, i++) {
        if (move->size < size) {
            i_best = i;
            size = move->size;
        }
    }

    for (move = moves, i = 0; move != NULL; move = move->next, i++) {
        if (i == i_best)
            break;
        res = cuddZddSwapInPlace(table, move->x, move->y);
        if (!res)
            return(0);
        if (i_best == -1 && res == size)
            break;
    }

    return(1);

}